

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedForward.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  undefined **ppuVar10;
  char **__argv;
  char *__src;
  char *pcVar11;
  size_t __n;
  bool bVar12;
  stat fs2;
  char self_path [4096];
  char msgbuf [4096];
  char exe [4096];
  char build_path_real [4096];
  char self_path_real [4096];
  stat local_50c8;
  char local_5038 [4096];
  stat local_4038 [28];
  char local_3038 [4096];
  char *local_2038;
  char *pcStack_2030;
  undefined8 local_2028;
  char local_1038 [4104];
  
  pcVar7 = *argv;
  cVar3 = *pcVar7;
  pcVar6 = pcVar7;
  if (cVar3 == '\0') {
LAB_00101388:
    pcVar6 = getenv("PATH");
    if ((pcVar6 != (char *)0x0) && (sVar8 = strlen(pcVar6), sVar8 != 0)) {
      pcVar11 = pcVar6;
      do {
        do {
          __src = pcVar11;
          cVar3 = *__src;
          pcVar11 = __src + 1;
        } while (cVar3 == ':');
        __n = 0xffffffffffffffff;
        lVar9 = 0;
        while ((cVar3 != '\0' && (cVar3 != ':'))) {
          lVar2 = __n + 2;
          lVar9 = lVar9 + -1;
          __n = __n + 1;
          cVar3 = __src[lVar2];
        }
        pcVar11 = __src + -lVar9;
        if (__src < pcVar11) {
          if ((__src[__n] != '/') && (__src[__n] != '\\')) {
            __n = -lVar9;
          }
          strncpy(local_5038,__src,__n);
          local_5038[__n] = '/';
          strcpy(local_5038 + __n + 1,pcVar7);
          iVar4 = access(local_5038,1);
          if (iVar4 == 0) {
            local_5038[__n] = '\0';
            goto LAB_00101488;
          }
        }
      } while (pcVar11 != pcVar6 + sVar8);
      pcVar7 = *argv;
    }
    fprintf(_stderr,"Error locating executable \"%s\".\n",pcVar7);
    return 1;
  }
  while( true ) {
    cVar1 = pcVar6[1];
    if (cVar1 == '\0') break;
    if ((cVar3 == '/') || (bVar12 = cVar3 == '\\', cVar3 = cVar1, pcVar6 = pcVar6 + 1, bVar12))
    goto LAB_0010131b;
  }
  if ((cVar3 != '\\') && (cVar3 != '/')) goto LAB_00101388;
LAB_0010131b:
  uVar5 = strlen(pcVar7);
  if ((long)uVar5 < 0) {
LAB_0010147e:
    local_5038[0] = '.';
    local_5038[1] = '\0';
  }
  else {
    sVar8 = 0xffffffff;
    do {
      if ((pcVar7[uVar5] == '\\') || (pcVar7[uVar5] == '/')) {
        sVar8 = uVar5 & 0xffffffff;
      }
      iVar4 = (int)sVar8;
    } while ((pcVar7 <= pcVar7 + (uVar5 - 1)) && (uVar5 = uVar5 - 1, iVar4 < 0));
    if (iVar4 < 0) goto LAB_0010147e;
    if (iVar4 == 0) {
      local_5038[0] = '/';
      local_5038[1] = '\0';
    }
    else {
      strncpy(local_5038,pcVar7,sVar8);
      local_5038[sVar8] = '\0';
    }
  }
LAB_00101488:
  pcVar7 = realpath(local_5038,local_1038);
  if (pcVar7 == (char *)0x0) {
    kwsys_shared_forward_strerror((char *)local_4038);
    fprintf(_stderr,"Error converting self path \"%s\" to real path: %s\n",local_5038,local_4038);
    return 1;
  }
  pcVar7 = realpath("/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/build_O3/Source/kwsys"
                    ,(char *)&local_2038);
  if ((((pcVar7 == (char *)0x0) || (iVar4 = stat(local_1038,local_4038), iVar4 != 0)) ||
      (iVar4 = stat((char *)&local_2038,&local_50c8), iVar4 != 0)) ||
     (((local_50c8.st_dev != local_4038[0].st_dev || (local_50c8.st_ino != local_4038[0].st_ino)) ||
      (local_50c8.st_size != local_4038[0].st_size)))) {
    ppuVar10 = (undefined **)&kwsys_shared_forward_get_settings_search_path_install;
  }
  else {
    ppuVar10 = &kwsys_shared_forward_get_settings_search_path_build;
  }
  pcVar7 = *ppuVar10;
  if (pcVar7 != (char *)0x0) {
    lVar9 = 0;
    do {
      if (lVar9 != 0) {
        sVar8 = strlen(kwsys_shared_forward_ldpath);
        (kwsys_shared_forward_ldpath + sVar8)[0] = ':';
        (kwsys_shared_forward_ldpath + sVar8)[1] = '\0';
      }
      sVar8 = strlen(kwsys_shared_forward_ldpath);
      iVar4 = kwsys_shared_forward_fullpath
                        (local_5038,pcVar7,kwsys_shared_forward_ldpath + sVar8,"runtime path entry")
      ;
      if (iVar4 == 0) {
        return 1;
      }
      pcVar7 = *(char **)((long)ppuVar10 + lVar9 + 8);
      lVar9 = lVar9 + 8;
    } while (pcVar7 != (char *)0x0);
  }
  iVar4 = kwsys_shared_forward_fullpath(local_5038,"cmsysTestProcess",local_3038,"executable file");
  if (iVar4 == 0) {
    return 1;
  }
  pcVar7 = getenv("LD_LIBRARY_PATH");
  if (pcVar7 != (char *)0x0) {
    sVar8 = strlen(kwsys_shared_forward_ldpath);
    (kwsys_shared_forward_ldpath + sVar8)[0] = ':';
    (kwsys_shared_forward_ldpath + sVar8)[1] = '\0';
    strcat(kwsys_shared_forward_ldpath,pcVar7);
  }
  putenv(kwsys_shared_forward_ldpath);
  __argv = argv;
  if (1 < argc) {
    pcVar7 = argv[1];
    iVar4 = strcmp(pcVar7,"--command");
    if (iVar4 == 0) {
      if (argc == 2) {
        main_cold_1();
        return 1;
      }
      strcpy(local_3038,argv[2]);
      __argv = argv + 2;
      if ((uint)argc < 4) goto LAB_00101743;
      pcVar7 = argv[3];
      argv = argv + 2;
    }
    iVar4 = strcmp(pcVar7,"--print");
    if (iVar4 == 0) {
      fprintf(_stdout,"%s\n",kwsys_shared_forward_ldpath);
      fprintf(_stdout,"%s\n",local_3038);
      return 0;
    }
    iVar4 = strcmp(pcVar7,"--ldd");
    __argv = argv;
    if (iVar4 == 0) {
      __argv = &local_2038;
      local_2038 = "ldd";
      local_2028 = 0;
      pcStack_2030 = local_3038;
      execvp("ldd",__argv);
      goto LAB_00101754;
    }
  }
LAB_00101743:
  *__argv = local_3038;
  execvp(local_3038,__argv);
LAB_00101754:
  kwsys_shared_forward_print_failure(__argv);
  return 1;
}

Assistant:

int main(int argc, char** argv)
{
  return cmsys_shared_forward_to_real(argc, argv);
}